

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O3

void run_CALL_cold_3(void)

{
  fwrite("Invalid input file!\n",0x14,1,_stderr);
  fprintf(_stderr,"Abort at line %d!\n",0x9f);
  exit(-1);
}

Assistant:

static set_t
set_load(FILE* f)
{
    set_t set = (set_t)malloc(sizeof(struct set));

    /* read projection (actually we don't support projection) */
    int k;
    if (fread(&k, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    if (k != -1) Abort("Invalid input file!\n"); // only support full vector

    /* read dd */
    lddmc_serialize_fromfile(f);
    size_t dd;
    if (fread(&dd, sizeof(size_t), 1, f) != 1) Abort("Invalid input file!\n");
    set->dd = lddmc_serialize_get_reversed(dd);
    lddmc_protect(&set->dd);

    return set;
}